

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::python::Generator::FixOptionsForField
          (Generator *this,FieldDescriptor *field,FieldDescriptorProto *proto)

{
  ushort *puVar1;
  string_view descriptor_str;
  string_view python_dict_name;
  string_view python_dict_name_00;
  string field_name;
  string local_70;
  char *local_50;
  size_t local_48;
  char local_40;
  undefined7 uStack_3f;
  
  local_48 = 0;
  local_40 = '\0';
  local_50 = &local_40;
  if ((field->field_0x1 & 8) == 0) {
    python_dict_name._M_str = "fields_by_name";
    python_dict_name._M_len = 0xe;
    FieldReferencingExpression_abi_cxx11_
              (&local_70,this,field->containing_type_,field,python_dict_name);
LAB_001f3c40:
    std::__cxx11::string::operator=((string *)&local_50,(string *)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == &local_70.field_2) goto LAB_001f3c6d;
  }
  else {
    if ((field->scope_).extension_scope != (Descriptor *)0x0) {
      python_dict_name_00._M_str = "extensions_by_name";
      python_dict_name_00._M_len = 0x12;
      FieldReferencingExpression_abi_cxx11_
                (&local_70,this,(field->scope_).extension_scope,field,python_dict_name_00);
      goto LAB_001f3c40;
    }
    puVar1 = (ushort *)(field->all_names_).payload_;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,(long)puVar1 + ~(ulong)*puVar1,(long)puVar1 + -1);
    std::__cxx11::string::operator=((string *)&local_50,(string *)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == &local_70.field_2) goto LAB_001f3c6d;
  }
  operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
LAB_001f3c6d:
  descriptor_str._M_str = local_50;
  descriptor_str._M_len = local_48;
  PrintDescriptorOptionsFixingCode<google::protobuf::FieldDescriptor>
            (this,field,proto,descriptor_str);
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  return;
}

Assistant:

void Generator::FixOptionsForField(const FieldDescriptor& field,
                                   const FieldDescriptorProto& proto) const {
  std::string field_name;
  if (field.is_extension()) {
    if (field.extension_scope() == nullptr) {
      // Top level extensions.
      field_name = std::string(field.name());
    } else {
      field_name = FieldReferencingExpression(field.extension_scope(), field,
                                              "extensions_by_name");
    }
  } else {
    field_name = FieldReferencingExpression(field.containing_type(), field,
                                            "fields_by_name");
  }
  PrintDescriptorOptionsFixingCode(field, proto, field_name);
}